

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_traits.hpp
# Opt level: O0

vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
* jsoncons::
  decode_traits<std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>,char,void>
  ::
  decode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>
            (basic_staj_cursor<char> *cursor,
            json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
            *decoder,error_code *ec)

{
  bool bVar1;
  staj_event_type sVar2;
  basic_staj_event<char> *this;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *in_RCX;
  basic_staj_cursor<char> *in_RDX;
  long *in_RSI;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *in_RDI;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  v;
  value_type *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  byte bVar3;
  undefined8 in_stack_ffffffffffffff78;
  conv_errc __e;
  basic_staj_event<char> *in_stack_ffffffffffffff80;
  wstring local_68 [32];
  undefined4 local_48;
  error_code *in_stack_ffffffffffffffd8;
  
  __e = (conv_errc)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            *)0xa15fab);
  (**(code **)(*in_RSI + 0x10))();
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)in_RCX);
  if (bVar1) {
    memset(in_RDI,0,0x18);
    std::
    vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              *)0xa15ff2);
  }
  else {
    in_stack_ffffffffffffff80 = (basic_staj_event<char> *)(**(code **)(*in_RSI + 0x20))();
    sVar2 = basic_staj_event<char>::event_type(in_stack_ffffffffffffff80);
    if (sVar2 == begin_array) {
      (**(code **)(*in_RSI + 0x40))(in_RSI,in_RCX);
      while( true ) {
        this = (basic_staj_event<char> *)(**(code **)(*in_RSI + 0x20))();
        sVar2 = basic_staj_event<char>::event_type(this);
        bVar3 = 0;
        if (sVar2 != end_array) {
          bVar1 = std::error_code::operator_cast_to_bool((error_code *)in_RCX);
          bVar3 = bVar1 ^ 0xff;
        }
        if ((bVar3 & 1) == 0) {
          std::
          vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    *)CONCAT17(bVar3,in_stack_ffffffffffffff70),
                   (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    *)in_stack_ffffffffffffff68);
          goto LAB_00a1618c;
        }
        decode_traits<std::__cxx11::wstring,char,void>::
        decode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>
                  (in_RDX,in_RCX,in_stack_ffffffffffffffd8);
        std::
        vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     *)CONCAT17(bVar3,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68);
        std::__cxx11::wstring::~wstring(local_68);
        bVar1 = std::error_code::operator_cast_to_bool((error_code *)in_RCX);
        if (bVar1) break;
        (**(code **)(*in_RSI + 0x40))(in_RSI,in_RCX);
      }
      memset(in_RDI,0,0x18);
      std::
      vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                *)0xa16134);
    }
    else {
      std::error_code::operator=((error_code *)in_stack_ffffffffffffff80,__e);
      std::
      vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
               (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                *)in_stack_ffffffffffffff68);
    }
  }
LAB_00a1618c:
  local_48 = 1;
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)in_stack_ffffffffffffff80);
  return in_RDI;
}

Assistant:

static T decode(basic_staj_cursor<CharT>& cursor, 
            json_decoder<Json,TempAllocator>& decoder, 
            std::error_code& ec)
        {
            T v;

            cursor.array_expected(ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                return T{};
            }
            if (cursor.current().event_type() != staj_event_type::begin_array)
            {
                ec = conv_errc::not_vector;
                return v;
            }
            cursor.next(ec);
            while (cursor.current().event_type() != staj_event_type::end_array && !ec)
            {
                v.push_back(decode_traits<value_type,CharT>::decode(cursor, decoder, ec));
                if (JSONCONS_UNLIKELY(ec)) {return T{};}
                //std::cout << "read next 10\n";
                cursor.next(ec);
            }
            return v;
        }